

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O3

void __thiscall roaring::Roaring64Map::addRangeClosed(Roaring64Map *this,uint64_t min,uint64_t max)

{
  _Rb_tree_node_base *p_Var1;
  iterator iVar2;
  _Rb_tree_node_base *p_Var3;
  uint32_t end_high;
  int iVar4;
  uint32_t start_high;
  
  if (min <= max) {
    start_high = (uint32_t)(min >> 0x20);
    end_high = (uint32_t)(max >> 0x20);
    iVar2 = ensureRangePopulated(this,start_high,end_high);
    if (min >> 0x20 == max >> 0x20) {
      roaring_bitmap_add_range_closed
                ((roaring_bitmap_t *)&iVar2._M_node[1]._M_parent,(uint32_t)min,(uint32_t)max);
    }
    else {
      roaring_bitmap_add_range_closed
                ((roaring_bitmap_t *)&iVar2._M_node[1]._M_parent,(uint32_t)min,0xffffffff);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(iVar2._M_node);
      if (~start_high + end_high != 0) {
        p_Var1 = p_Var3 + 1;
        roaring_bitmap_add_range_closed((roaring_bitmap_t *)&p_Var1->_M_parent,0,0xffffffff);
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        if (~start_high + end_high != 1) {
          iVar4 = (end_high - start_high) + -2;
          do {
            Roaring::operator=((Roaring *)&p_Var3[1]._M_parent,(Roaring *)&p_Var1->_M_parent);
            p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
      }
      roaring_bitmap_add_range_closed((roaring_bitmap_t *)&p_Var3[1]._M_parent,0,(uint32_t)max);
    }
  }
  return;
}

Assistant:

void addRangeClosed(uint64_t min, uint64_t max) {
        if (min > max) {
            return;
        }
        uint32_t start_high = highBytes(min);
        uint32_t start_low = lowBytes(min);
        uint32_t end_high = highBytes(max);
        uint32_t end_low = lowBytes(max);

        // We put std::numeric_limits<>::max in parentheses to avoid a
        // clash with the Windows.h header under Windows.
        const uint32_t uint32_max = (std::numeric_limits<uint32_t>::max)();

        // Fill in any nonexistent slots with empty Roarings. This simplifies
        // the logic below, allowing it to simply iterate over the map between
        // 'start_high' and 'end_high' in a linear fashion.
        auto current_iter = ensureRangePopulated(start_high, end_high);

        // If start and end land on the same inner bitmap, then we can do the
        // whole operation in one call.
        if (start_high == end_high) {
            auto &bitmap = current_iter->second;
            bitmap.addRangeClosed(start_low, end_low);
            return;
        }

        // Because start and end don't land on the same inner bitmap,
        // we need to do this in multiple steps:
        // 1. Partially fill the first bitmap with values from the closed
        //    interval [start_low, uint32_max]
        // 2. Fill intermediate bitmaps completely: [0, uint32_max]
        // 3. Partially fill the last bitmap with values from the closed
        //    interval [0, end_low]
        auto num_intermediate_bitmaps = end_high - start_high - 1;

        // Step 1: Partially fill the first bitmap.
        {
            auto &bitmap = current_iter->second;
            bitmap.addRangeClosed(start_low, uint32_max);
            ++current_iter;
        }

        // Step 2. Fill intermediate bitmaps completely.
        if (num_intermediate_bitmaps != 0) {
            auto &first_intermediate = current_iter->second;
            first_intermediate.addRangeClosed(0, uint32_max);
            ++current_iter;

            // Now make (num_intermediate_bitmaps - 1) copies of this.
            for (uint32_t i = 1; i != num_intermediate_bitmaps; ++i) {
                auto &next_intermediate = current_iter->second;
                next_intermediate = first_intermediate;
                ++current_iter;
            }
        }

        // Step 3: Partially fill the last bitmap.
        auto &bitmap = current_iter->second;
        bitmap.addRangeClosed(0, end_low);
    }